

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O0

int Cmd_RunAutoTunerEval(Vec_Ptr_t *vAigs,satoko_opts_t *pOpts,int nProcs)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  Vec_Ptr_t *p;
  void *pvVar5;
  Vec_Ptr_t *vStack;
  int TotalCost;
  int fWorkToDo;
  int status;
  int i;
  pthread_t WorkerThread [100];
  Cmd_AutoData_t ThData [100];
  int nProcs_local;
  satoko_opts_t *pOpts_local;
  Vec_Ptr_t *vAigs_local;
  
  bVar3 = true;
  vStack._0_4_ = 0;
  if (nProcs == 1) {
    ThData[99].Result = nProcs;
    vAigs_local._4_4_ = Cmd_RunAutoTunerEvalSimple(vAigs,pOpts);
  }
  else {
    ThData[99].Result = nProcs + -1;
    if ((ThData[99].Result < 1) || (100 < ThData[99].Result)) {
      __assert_fail("nProcs >= 1 && nProcs <= CMD_THR_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                    ,0xa1,"int Cmd_RunAutoTunerEval(Vec_Ptr_t *, satoko_opts_t *, int)");
    }
    for (fWorkToDo = 0; fWorkToDo < ThData[99].Result; fWorkToDo = fWorkToDo + 1) {
      ThData[(long)fWorkToDo + -1].fWorking = 0;
      ThData[(long)fWorkToDo + -1].Result = 0;
      ThData[fWorkToDo].pGia = (Gia_Man_t *)pOpts;
      *(int *)&ThData[fWorkToDo].pOpts = fWorkToDo;
      *(undefined4 *)((long)&ThData[fWorkToDo].pOpts + 4) = 0xffffffff;
      ThData[fWorkToDo].iThread = 0;
      ThData[fWorkToDo].nTimeOut = -1;
      iVar4 = pthread_create((pthread_t *)(&status + (long)fWorkToDo * 2),(pthread_attr_t *)0x0,
                             Cmd_RunAutoTunerEvalWorkerThread,&ThData[(long)fWorkToDo + -1].fWorking
                            );
      if (iVar4 != 0) {
        __assert_fail("status == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                      ,0xab,"int Cmd_RunAutoTunerEval(Vec_Ptr_t *, satoko_opts_t *, int)");
      }
    }
    p = Vec_PtrDup(vAigs);
    while (bVar3) {
      iVar4 = Vec_PtrSize(p);
      bVar3 = 0 < iVar4;
      for (fWorkToDo = 0; fWorkToDo < ThData[99].Result; fWorkToDo = fWorkToDo + 1) {
        if (ThData[fWorkToDo].iThread == 0) {
          lVar1._0_4_ = ThData[(long)fWorkToDo + -1].fWorking;
          lVar1._4_4_ = ThData[(long)fWorkToDo + -1].Result;
          if (lVar1 != 0) {
            if (ThData[fWorkToDo].nTimeOut < 0) {
              __assert_fail("ThData[i].Result >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                            ,0xbd,"int Cmd_RunAutoTunerEval(Vec_Ptr_t *, satoko_opts_t *, int)");
            }
            vStack._0_4_ = ThData[fWorkToDo].nTimeOut + (int)vStack;
            ThData[(long)fWorkToDo + -1].fWorking = 0;
            ThData[(long)fWorkToDo + -1].Result = 0;
          }
          iVar4 = Vec_PtrSize(p);
          if (iVar4 != 0) {
            lVar2._0_4_ = ThData[(long)fWorkToDo + -1].fWorking;
            lVar2._4_4_ = ThData[(long)fWorkToDo + -1].Result;
            if (lVar2 != 0) {
              __assert_fail("ThData[i].pGia == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                            ,0xc4,"int Cmd_RunAutoTunerEval(Vec_Ptr_t *, satoko_opts_t *, int)");
            }
            pvVar5 = Vec_PtrPop(p);
            *(void **)&ThData[(long)fWorkToDo + -1].fWorking = pvVar5;
            ThData[fWorkToDo].iThread = 1;
          }
        }
        else {
          bVar3 = true;
        }
      }
    }
    Vec_PtrFree(p);
    for (fWorkToDo = 0; fWorkToDo < ThData[99].Result; fWorkToDo = fWorkToDo + 1) {
      if (ThData[fWorkToDo].iThread != 0) {
        __assert_fail("!ThData[i].fWorking",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                      ,0xcd,"int Cmd_RunAutoTunerEval(Vec_Ptr_t *, satoko_opts_t *, int)");
      }
      ThData[(long)fWorkToDo + -1].fWorking = 0;
      ThData[(long)fWorkToDo + -1].Result = 0;
      ThData[fWorkToDo].iThread = 1;
    }
    vAigs_local._4_4_ = (int)vStack;
  }
  return vAigs_local._4_4_;
}

Assistant:

int Cmd_RunAutoTunerEval( Vec_Ptr_t * vAigs, satoko_opts_t * pOpts, int nProcs )
{
    Cmd_AutoData_t ThData[CMD_THR_MAX];
    pthread_t WorkerThread[CMD_THR_MAX];
    int i, status, fWorkToDo = 1, TotalCost = 0;
    Vec_Ptr_t * vStack;
    if ( nProcs == 1 )
        return Cmd_RunAutoTunerEvalSimple( vAigs, pOpts );
    // subtract manager thread
    nProcs--;
    assert( nProcs >= 1 && nProcs <= CMD_THR_MAX );
    // start threads
    for ( i = 0; i < nProcs; i++ )
    {
        ThData[i].pGia     = NULL;
        ThData[i].pOpts    = pOpts;
        ThData[i].iThread  = i;
        ThData[i].nTimeOut = -1;
        ThData[i].fWorking = 0;
        ThData[i].Result   = -1;
        status = pthread_create( WorkerThread + i, NULL,Cmd_RunAutoTunerEvalWorkerThread, (void *)(ThData + i) );  assert( status == 0 );
    }
    // look at the threads
    vStack = Vec_PtrDup(vAigs);
    while ( fWorkToDo )
    {
        fWorkToDo = (int)(Vec_PtrSize(vStack) > 0);
        for ( i = 0; i < nProcs; i++ )
        {
            // check if this thread is working
            if ( ThData[i].fWorking )
            {
                fWorkToDo = 1;
                continue;
            }
            // check if this thread has recently finished
            if ( ThData[i].pGia != NULL )
            {
                assert( ThData[i].Result >= 0 );
                TotalCost += ThData[i].Result;
                ThData[i].pGia = NULL;
            }
            if ( Vec_PtrSize(vStack) == 0 )
                continue;
            // give this thread a new job
            assert( ThData[i].pGia == NULL );
            ThData[i].pGia = (Gia_Man_t *)Vec_PtrPop( vStack );
            ThData[i].fWorking = 1;
        }
    }
    Vec_PtrFree( vStack );
    // stop threads
    for ( i = 0; i < nProcs; i++ )
    {
        assert( !ThData[i].fWorking );
        // stop
        ThData[i].pGia = NULL;
        ThData[i].fWorking = 1;
    }
    return TotalCost;
}